

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O0

ssize_t __thiscall
Dashel::UDPSocketStream::send(UDPSocketStream *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int __fd_00;
  _func_int *p_Var1;
  uchar *__buf_00;
  size_t sVar2;
  size_t sVar3;
  int *piVar4;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  ssize_t sent;
  sockaddr_in addr;
  IPV4Address *dest_local;
  UDPSocketStream *this_local;
  
  addr.sin_zero._4_4_ = in_register_00000034;
  addr.sin_zero._0_4_ = __fd;
  sent._0_2_ = 2;
  sent._2_2_ = htons(*(uint16_t *)((long)addr.sin_zero + 4));
  sent._4_4_ = htonl(*(uint32_t *)addr.sin_zero);
  __fd_00 = *(int *)&(this->super_MemoryPacketStream).super_PacketStream.field_0x78;
  __buf_00 = ExpandableBuffer::get
                       ((ExpandableBuffer *)
                        &(this->super_MemoryPacketStream).super_PacketStream.field_0x8);
  sVar2 = ExpandableBuffer::size
                    ((ExpandableBuffer *)
                     &(this->super_MemoryPacketStream).super_PacketStream.field_0x8);
  sVar2 = sendto(__fd_00,__buf_00,sVar2,0,(sockaddr *)&sent,0x10);
  if (-1 < (long)sVar2) {
    sVar3 = ExpandableBuffer::size
                      ((ExpandableBuffer *)
                       &(this->super_MemoryPacketStream).super_PacketStream.field_0x8);
    if (sVar2 == sVar3) goto LAB_00139813;
  }
  p_Var1 = (this->super_MemoryPacketStream).super_PacketStream._vptr_PacketStream[-3];
  piVar4 = __errno_location();
  Stream::fail((Stream *)
               ((long)&(this->super_MemoryPacketStream).super_PacketStream._vptr_PacketStream +
               (long)p_Var1),IOError,*piVar4,"UDP Socket write I/O error.");
LAB_00139813:
  ExpandableBuffer::clear
            ((ExpandableBuffer *)&(this->super_MemoryPacketStream).super_PacketStream.field_0x8);
  return extraout_RAX;
}

Assistant:

virtual void send(const IPV4Address& dest)
		{
			sockaddr_in addr;
			addr.sin_family = AF_INET;
			addr.sin_port = htons(dest.port);
			addr.sin_addr.s_addr = htonl(dest.address);

			ssize_t sent = sendto(fd, sendBuffer.get(), sendBuffer.size(), 0, (struct sockaddr*)&addr, sizeof(addr));
			if (sent < 0 || static_cast<size_t>(sent) != sendBuffer.size())
				fail(DashelException::IOError, errno, "UDP Socket write I/O error.");

			sendBuffer.clear();
		}